

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O2

TextureBindingSp __thiscall
vkt::sr::anon_unknown_0::createEmptyTexture
          (anon_unknown_0 *this,deUint32 format,TextureType type,IVec3 *textureSize,int numLevels,
          int lodBase,Sampler *sampler)

{
  long lVar1;
  Texture1D *pTVar2;
  Texture1DArray *this_00;
  Texture3D *this_01;
  TextureCube *this_02;
  Texture2D *this_03;
  Texture2DArray *this_04;
  TextureCubeArray *this_05;
  TextureBinding *pTVar3;
  SharedPtrStateBase *extraout_RDX;
  SharedPtrStateBase *extraout_RDX_00;
  SharedPtrStateBase *extraout_RDX_01;
  SharedPtrStateBase *extraout_RDX_02;
  SharedPtrStateBase *extraout_RDX_03;
  SharedPtrStateBase *extraout_RDX_04;
  SharedPtrStateBase *extraout_RDX_05;
  SharedPtrStateBase *extraout_RDX_06;
  SharedPtrStateBase *pSVar4;
  int level;
  int iVar5;
  int face;
  CubeFace face_00;
  TextureBindingSp TVar6;
  MovePtr<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_> texture;
  SharedPtr<vkt::sr::TextureBinding> local_48;
  TextureFormat texFmt;
  
  texFmt = glu::mapGLInternalFormat(format);
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  pSVar4 = extraout_RDX;
  switch(type) {
  case TEXTURETYPE_1D:
    pTVar2 = (Texture1D *)operator_new(0x50);
    tcu::Texture1D::Texture1D(pTVar2,&texFmt,textureSize->m_data[0]);
    iVar5 = 0;
    texture.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.ptr =
         pTVar2;
    if (numLevels < 1) {
      numLevels = 0;
      iVar5 = 0;
    }
    for (; numLevels != iVar5; iVar5 = iVar5 + 1) {
      tcu::Texture1D::allocLevel
                (texture.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.
                 m_data.ptr,iVar5);
    }
    pTVar3 = (TextureBinding *)operator_new(0x68);
    pTVar2 = texture.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.
             ptr;
    texture.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.ptr =
         (Texture1D *)0x0;
    TextureBinding::TextureBinding(pTVar3,pTVar2,sampler);
    de::SharedPtr<vkt::sr::TextureBinding>::SharedPtr(&local_48,pTVar3);
    de::SharedPtr<vkt::sr::TextureBinding>::operator=
              ((SharedPtr<vkt::sr::TextureBinding> *)this,&local_48);
    de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr(&local_48);
    de::details::UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>::~UniqueBase
              (&texture.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>);
    pSVar4 = extraout_RDX_02;
    break;
  case TEXTURETYPE_2D:
    this_03 = (Texture2D *)operator_new(0x50);
    tcu::Texture2D::Texture2D(this_03,&texFmt,textureSize->m_data[0],textureSize->m_data[1]);
    iVar5 = 0;
    texture.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.ptr =
         (Texture1D *)this_03;
    if (numLevels < 1) {
      numLevels = 0;
      iVar5 = 0;
    }
    for (; numLevels != iVar5; iVar5 = iVar5 + 1) {
      tcu::Texture2D::allocLevel
                ((Texture2D *)
                 texture.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.
                 m_data.ptr,iVar5);
    }
    pTVar3 = (TextureBinding *)operator_new(0x68);
    pTVar2 = texture.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.
             ptr;
    texture.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.ptr =
         (Texture1D *)0x0;
    TextureBinding::TextureBinding(pTVar3,(Texture2D *)pTVar2,sampler);
    de::SharedPtr<vkt::sr::TextureBinding>::SharedPtr(&local_48,pTVar3);
    de::SharedPtr<vkt::sr::TextureBinding>::operator=
              ((SharedPtr<vkt::sr::TextureBinding> *)this,&local_48);
    de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr(&local_48);
    de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::~UniqueBase
              ((UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> *)&texture);
    pSVar4 = extraout_RDX_03;
    break;
  case TEXTURETYPE_3D:
    this_01 = (Texture3D *)operator_new(0x58);
    tcu::Texture3D::Texture3D
              (this_01,&texFmt,textureSize->m_data[0],textureSize->m_data[1],textureSize->m_data[2])
    ;
    iVar5 = 0;
    texture.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.ptr =
         (Texture1D *)this_01;
    if (numLevels < 1) {
      numLevels = 0;
      iVar5 = 0;
    }
    for (; numLevels != iVar5; iVar5 = iVar5 + 1) {
      tcu::Texture3D::allocLevel
                ((Texture3D *)
                 texture.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.
                 m_data.ptr,iVar5);
    }
    pTVar3 = (TextureBinding *)operator_new(0x68);
    pTVar2 = texture.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.
             ptr;
    texture.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.ptr =
         (Texture1D *)0x0;
    TextureBinding::TextureBinding(pTVar3,(Texture3D *)pTVar2,sampler);
    de::SharedPtr<vkt::sr::TextureBinding>::SharedPtr(&local_48,pTVar3);
    de::SharedPtr<vkt::sr::TextureBinding>::operator=
              ((SharedPtr<vkt::sr::TextureBinding> *)this,&local_48);
    de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr(&local_48);
    de::details::UniqueBase<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_>::~UniqueBase
              ((UniqueBase<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_> *)&texture);
    pSVar4 = extraout_RDX_01;
    break;
  case TEXTURETYPE_CUBE_MAP:
    this_02 = (TextureCube *)operator_new(0x168);
    tcu::TextureCube::TextureCube(this_02,&texFmt,textureSize->m_data[0]);
    iVar5 = 0;
    texture.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.ptr =
         (Texture1D *)this_02;
    if (numLevels < 1) {
      numLevels = 0;
      iVar5 = 0;
    }
    for (; iVar5 != numLevels; iVar5 = iVar5 + 1) {
      for (face_00 = CUBEFACE_NEGATIVE_X; face_00 != CUBEFACE_LAST;
          face_00 = face_00 + CUBEFACE_POSITIVE_X) {
        tcu::TextureCube::allocLevel
                  ((TextureCube *)
                   texture.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.
                   m_data.ptr,face_00,iVar5);
      }
    }
    pTVar3 = (TextureBinding *)operator_new(0x68);
    pTVar2 = texture.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.
             ptr;
    texture.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.ptr =
         (Texture1D *)0x0;
    TextureBinding::TextureBinding(pTVar3,(TextureCube *)pTVar2,sampler);
    de::SharedPtr<vkt::sr::TextureBinding>::SharedPtr(&local_48,pTVar3);
    de::SharedPtr<vkt::sr::TextureBinding>::operator=
              ((SharedPtr<vkt::sr::TextureBinding> *)this,&local_48);
    de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr(&local_48);
    de::details::UniqueBase<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_>::~UniqueBase
              ((UniqueBase<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_> *)&texture);
    pSVar4 = extraout_RDX_06;
    break;
  case TEXTURETYPE_1D_ARRAY:
    this_00 = (Texture1DArray *)operator_new(0x50);
    tcu::Texture1DArray::Texture1DArray
              (this_00,&texFmt,textureSize->m_data[0],textureSize->m_data[2]);
    iVar5 = 0;
    texture.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.ptr =
         (Texture1D *)this_00;
    if (numLevels < 1) {
      numLevels = 0;
      iVar5 = 0;
    }
    for (; numLevels != iVar5; iVar5 = iVar5 + 1) {
      tcu::Texture1DArray::allocLevel
                ((Texture1DArray *)
                 texture.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.
                 m_data.ptr,iVar5);
    }
    pTVar3 = (TextureBinding *)operator_new(0x68);
    pTVar2 = texture.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.
             ptr;
    texture.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.ptr =
         (Texture1D *)0x0;
    TextureBinding::TextureBinding(pTVar3,(Texture1DArray *)pTVar2,sampler);
    de::SharedPtr<vkt::sr::TextureBinding>::SharedPtr(&local_48,pTVar3);
    de::SharedPtr<vkt::sr::TextureBinding>::operator=
              ((SharedPtr<vkt::sr::TextureBinding> *)this,&local_48);
    de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr(&local_48);
    de::details::UniqueBase<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_>::
    ~UniqueBase((UniqueBase<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_> *)
                &texture);
    pSVar4 = extraout_RDX_00;
    break;
  case TEXTURETYPE_2D_ARRAY:
    this_04 = (Texture2DArray *)operator_new(0x58);
    tcu::Texture2DArray::Texture2DArray
              (this_04,&texFmt,textureSize->m_data[0],textureSize->m_data[1],textureSize->m_data[2])
    ;
    iVar5 = 0;
    texture.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.ptr =
         (Texture1D *)this_04;
    if (numLevels < 1) {
      numLevels = 0;
      iVar5 = 0;
    }
    for (; numLevels != iVar5; iVar5 = iVar5 + 1) {
      tcu::Texture2DArray::allocLevel
                ((Texture2DArray *)
                 texture.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.
                 m_data.ptr,iVar5);
    }
    pTVar3 = (TextureBinding *)operator_new(0x68);
    pTVar2 = texture.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.
             ptr;
    texture.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.ptr =
         (Texture1D *)0x0;
    TextureBinding::TextureBinding(pTVar3,(Texture2DArray *)pTVar2,sampler);
    de::SharedPtr<vkt::sr::TextureBinding>::SharedPtr(&local_48,pTVar3);
    de::SharedPtr<vkt::sr::TextureBinding>::operator=
              ((SharedPtr<vkt::sr::TextureBinding> *)this,&local_48);
    de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr(&local_48);
    de::details::UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>::
    ~UniqueBase((UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_> *)
                &texture);
    pSVar4 = extraout_RDX_04;
    break;
  case TEXTURETYPE_CUBE_ARRAY:
    this_05 = (TextureCubeArray *)operator_new(0x50);
    tcu::TextureCubeArray::TextureCubeArray
              (this_05,&texFmt,textureSize->m_data[0],textureSize->m_data[2]);
    iVar5 = 0;
    texture.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.ptr =
         (Texture1D *)this_05;
    if (numLevels < 1) {
      numLevels = 0;
      iVar5 = 0;
    }
    for (; numLevels != iVar5; iVar5 = iVar5 + 1) {
      tcu::TextureCubeArray::allocLevel
                ((TextureCubeArray *)
                 texture.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.
                 m_data.ptr,iVar5);
    }
    pTVar3 = (TextureBinding *)operator_new(0x68);
    pTVar2 = texture.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.
             ptr;
    texture.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.ptr =
         (Texture1D *)0x0;
    TextureBinding::TextureBinding(pTVar3,(TextureCubeArray *)pTVar2,sampler);
    de::SharedPtr<vkt::sr::TextureBinding>::SharedPtr(&local_48,pTVar3);
    de::SharedPtr<vkt::sr::TextureBinding>::operator=
              ((SharedPtr<vkt::sr::TextureBinding> *)this,&local_48);
    de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr(&local_48);
    de::details::UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>::
    ~UniqueBase((UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_> *)
                &texture);
    pSVar4 = extraout_RDX_05;
  }
  lVar1 = *(long *)this;
  *(int *)(lVar1 + 0x40) = lodBase;
  *(undefined8 *)(lVar1 + 0x44) = 0x400000003;
  *(undefined8 *)(lVar1 + 0x4c) = 0x600000005;
  *(undefined8 *)(lVar1 + 0x54) = 1;
  TVar6.m_state = pSVar4;
  TVar6.m_ptr = (TextureBinding *)this;
  return TVar6;
}

Assistant:

static TextureBindingSp createEmptyTexture (deUint32				format,
											TextureType				type,
											const tcu::IVec3&		textureSize,
											int						numLevels,
											int						lodBase,
											const tcu::Sampler&		sampler)
{
	const tcu::TextureFormat			texFmt				= glu::mapGLInternalFormat(format);
	const TextureBinding::Parameters	params				(lodBase);
	TextureBindingSp					textureBinding;

	switch (type)
	{

		case TEXTURETYPE_1D:
		{
			de::MovePtr<tcu::Texture1D>			texture		(new tcu::Texture1D(texFmt, textureSize.x()));

			for (int level = 0; level < numLevels; level++)
				texture->allocLevel(level);

			textureBinding = TextureBindingSp(new TextureBinding(texture.release(), sampler));
			break;
		}

		case TEXTURETYPE_2D:
		{
			de::MovePtr<tcu::Texture2D>			texture		(new tcu::Texture2D(texFmt, textureSize.x(), textureSize.y()));

			for (int level = 0; level < numLevels; level++)
				texture->allocLevel(level);

			textureBinding = TextureBindingSp(new TextureBinding(texture.release(), sampler));
			break;
		}

		case TEXTURETYPE_3D:
		{
			de::MovePtr<tcu::Texture3D>			texture		(new tcu::Texture3D(texFmt, textureSize.x(), textureSize.y(), textureSize.z()));

			for (int level = 0; level < numLevels; level++)
				texture->allocLevel(level);

			textureBinding = TextureBindingSp(new TextureBinding(texture.release(), sampler));
			break;
		}

		case TEXTURETYPE_CUBE_MAP:
		{
			de::MovePtr<tcu::TextureCube>		texture		(new tcu::TextureCube(texFmt, textureSize.x()));

			for (int level = 0; level < numLevels; level++)
				for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
					texture->allocLevel((tcu::CubeFace)face, level);

			textureBinding = TextureBindingSp(new TextureBinding(texture.release(), sampler));
			break;
		}

		case TEXTURETYPE_1D_ARRAY:
		{
			de::MovePtr<tcu::Texture1DArray>	texture		(new tcu::Texture1DArray(texFmt, textureSize.x(), textureSize.z()));

			for (int level = 0; level < numLevels; level++)
				texture->allocLevel(level);

			textureBinding = TextureBindingSp(new TextureBinding(texture.release(), sampler));
			break;
		}

		case TEXTURETYPE_2D_ARRAY:
		{
			de::MovePtr<tcu::Texture2DArray>	texture		(new tcu::Texture2DArray(texFmt, textureSize.x(), textureSize.y(), textureSize.z()));

			for (int level = 0; level < numLevels; level++)
				texture->allocLevel(level);

			textureBinding = TextureBindingSp(new TextureBinding(texture.release(), sampler));
			break;
		}

		case TEXTURETYPE_CUBE_ARRAY:
		{
			de::MovePtr<tcu::TextureCubeArray>	texture		(new tcu::TextureCubeArray(texFmt, textureSize.x(), textureSize.z()));

			for (int level = 0; level < numLevels; level++)
				texture->allocLevel(level);

			textureBinding = TextureBindingSp(new TextureBinding(texture.release(), sampler));
			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	textureBinding->setParameters(params);
	return textureBinding;
}